

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

string * __thiscall
deqp::gls::probabilityStr_abi_cxx11_(string *__return_storage_ptr__,gls *this,float prob)

{
  int in_EDX;
  char *__s;
  string local_30;
  
  if ((prob != 0.0) || (NAN(prob))) {
    if ((prob != 1.0) || (NAN(prob))) {
      de::floatToString_abi_cxx11_(&local_30,(de *)0x0,prob * 100.0,in_EDX);
      std::operator+(__return_storage_ptr__,&local_30,"%");
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    __s = "ALWAYS";
  }
  else {
    __s = "never";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static inline string probabilityStr (const float prob)
{
	return prob == 0.0f ? "never"	:
		   prob == 1.0f ? "ALWAYS"	:
		   de::floatToString(prob*100.0f, 0) + "%";
}